

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::NumericToHugeDecimalCast<short>
               (short input,hugeint_t *result,CastParameters *parameters,uint8_t width,uint8_t scale
               )

{
  bool bVar1;
  byte in_CL;
  long lVar2;
  uint64_t *in_RSI;
  byte in_R8B;
  hugeint_t hVar3;
  string error;
  hugeint_t hinput;
  hugeint_t max_width;
  hugeint_t *in_stack_ffffffffffffff18;
  CastParameters *parameters_00;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 uVar4;
  hugeint_t *this;
  undefined1 in_stack_ffffffffffffff28 [16];
  hugeint_t *in_stack_ffffffffffffff38;
  hugeint_t *in_stack_ffffffffffffff40;
  uchar in_stack_ffffffffffffff6e;
  allocator<char> in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string asStack_70 [32];
  hugeint_t hStack_50;
  hugeint_t hStack_40;
  undefined8 uStack_30;
  undefined8 uStack_28;
  uint64_t *puStack_10;
  byte bStack_1;
  
  this = in_stack_ffffffffffffff28._0_8_;
  lVar2 = (long)(int)((uint)in_CL - (uint)in_R8B) * 0x10;
  uStack_30 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar2);
  uStack_28 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar2 + 8);
  puStack_10 = in_RSI;
  hStack_40 = Hugeint::Convert<short>(in_stack_ffffffffffffff28._14_2_);
  bVar1 = hugeint_t::operator>=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  uVar4 = true;
  if (!bVar1) {
    hStack_50 = hugeint_t::operator-((hugeint_t *)CONCAT17(1,in_stack_ffffffffffffff20));
    uVar4 = hugeint_t::operator<=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  if ((bool)uVar4 == false) {
    hVar3 = hugeint_t::operator*(in_stack_ffffffffffffff18,(hugeint_t *)0x2b12760);
    *puStack_10 = hVar3.lower;
    puStack_10[1] = hVar3.upper;
    bStack_1 = 1;
  }
  else {
    parameters_00 = (CastParameters *)&stack0xffffffffffffff6f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"Could not cast value %s to DECIMAL(%d,%d)",
               (allocator *)parameters_00);
    hugeint_t::ToString(this);
    StringUtil::
    Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_unsigned_char>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(uchar)in_stack_ffffffffffffff6f,
               in_stack_ffffffffffffff6e);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    HandleCastError::AssignError((string *)CONCAT17(uVar4,in_stack_ffffffffffffff20),parameters_00);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_70);
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool NumericToHugeDecimalCast(SRC input, hugeint_t &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	hugeint_t hinput = Hugeint::Convert(input);
	if (hinput >= max_width || hinput <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", hinput.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = hinput * Hugeint::POWERS_OF_TEN[scale];
	return true;
}